

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O0

void __thiscall UnifiedRegex::RuntimeCharTrie::Print(RuntimeCharTrie *this,DebugWriter *w)

{
  int local_1c;
  int i;
  DebugWriter *w_local;
  RuntimeCharTrie *this_local;
  
  DebugWriter::Indent(w);
  for (local_1c = 0; local_1c < this->count; local_1c = local_1c + 1) {
    DebugWriter::PrintQuotedChar(w,this->children[local_1c].c);
    DebugWriter::EOL(w);
    Print(&this->children[local_1c].node,w);
  }
  DebugWriter::Unindent(w);
  return;
}

Assistant:

void RuntimeCharTrie::Print(DebugWriter* w) const
    {
        w->Indent();
        for (int i = 0; i < count; i++)
        {
            w->PrintQuotedChar(children[i].c);
            w->EOL();
            children[i].node.Print(w);
        }
        w->Unindent();
    }